

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

JitEquivalentTypeGuard * __thiscall
Lowerer::CreateEquivalentTypeGuardAndLinkToGuardedProperties
          (Lowerer *this,PropertySymOpnd *propertySymOpnd)

{
  Type TVar1;
  Func *this_00;
  long lVar2;
  code *pcVar3;
  BVSparse<Memory::JitArenaAllocator> *pBVar4;
  bool bVar5;
  bool bVar6;
  uint16 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  BVIndex capacity;
  TypeId typeId;
  undefined4 *puVar11;
  EquivalentTypeSet *pEVar12;
  JITType *pJVar13;
  ulong uVar14;
  JITTypeHolder type;
  FunctionJITTimeInfo *pFVar15;
  ObjTypeSpecFldInfo *pOVar16;
  JITTimeFunctionBody *pJVar17;
  char16 *pcVar18;
  char16 *pcVar19;
  EquivalentTypeCache *pEVar20;
  Type *pTVar21;
  BVSparse<Memory::JitArenaAllocator> *pBVar22;
  EquivalentPropertyEntry *__dest;
  uint16 ti;
  ushort index;
  Lowerer *pLVar23;
  ulong uVar24;
  uint16 ti_1;
  byte bVar25;
  JITTypeHolderBase<void> local_128;
  char16 debugStringBuffer [42];
  BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  propIds;
  BVUnitT<unsigned_long> local_88;
  SparseBVUnit _unit;
  JitPolyEquivalentTypeGuard *local_60;
  EquivalentPropertyEntry *local_58;
  EquivalentPropertyEntry *entry;
  BVSparse<Memory::JitArenaAllocator> *local_48;
  Lowerer *local_40;
  uint local_38;
  char local_31;
  PropertyId propertyId;
  
  if (((propertySymOpnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
      (bVar5 = IR::PropertySymOpnd::HasEquivalentTypeSet(propertySymOpnd), !bVar5)) ||
     (propertySymOpnd->guardedPropOps == (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1f15,
                       "(propertySymOpnd->HasObjTypeSpecFldInfo() && propertySymOpnd->HasEquivalentTypeSet() && propertySymOpnd->GetGuardedPropOps())"
                       ,
                       "propertySymOpnd->HasObjTypeSpecFldInfo() && propertySymOpnd->HasEquivalentTypeSet() && propertySymOpnd->GetGuardedPropOps()"
                      );
    if (!bVar5) goto LAB_0056c854;
    *puVar11 = 0;
  }
  bVar5 = IR::PropertySymOpnd::ShouldUsePolyEquivTypeGuard(propertySymOpnd,this->m_func);
  this_00 = this->m_func;
  local_40 = this;
  if (bVar5) {
    uVar8 = IR::PropertySymOpnd::GetObjTypeSpecFldId(propertySymOpnd);
    local_60 = Func::CreatePolyEquivalentTypeGuard(this_00,uVar8);
    pEVar12 = IR::PropertySymOpnd::GetEquivalentTypeSet(propertySymOpnd);
    for (index = 0; this = local_40, index < pEVar12->count; index = index + 1) {
      local_128.t = (Type)Js::EquivalentTypeSet::GetType(pEVar12,index);
      pJVar13 = JITTypeHolderBase<void>::operator->(&local_128);
      uVar14 = JITType::GetAddr(pJVar13);
      Js::JitPolyEquivalentTypeGuard::SetPolyValue(local_60,uVar14,(byte)(uVar14 >> 6) & 7);
    }
  }
  else {
    type = IR::PropertySymOpnd::GetFirstEquivalentType(propertySymOpnd);
    uVar8 = IR::PropertySymOpnd::GetObjTypeSpecFldId(propertySymOpnd);
    local_60 = (JitPolyEquivalentTypeGuard *)Func::CreateEquivalentTypeGuard(this_00,type,uVar8);
  }
  pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  bVar5 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar15);
  if (bVar5) {
    pBVar22 = propertySymOpnd->guardedPropOps;
    pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    bVar5 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar15);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1fd8,
                         "(this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())"
                         ,"this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards()"
                        );
      if (!bVar5) goto LAB_0056c854;
      *puVar11 = 0;
    }
    if (pBVar22 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1fd9,"(guardedPropOps != nullptr)","guardedPropOps != nullptr");
      if (!bVar5) goto LAB_0056c854;
      *puVar11 = 0;
    }
    else {
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    }
    entry = (EquivalentPropertyEntry *)&DAT_01453738;
    while (pBVar22 = (BVSparse<Memory::JitArenaAllocator> *)pBVar22->head,
          pBVar22 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      TVar1 = *(Type *)&pBVar22->lastFoundIndex;
      unique0x00012000 = ((Type *)&pBVar22->alloc)->word;
      local_48 = pBVar22;
      while (pBVar22 = local_48, stack0xffffffffffffff30 != 0) {
        lVar2 = 0;
        if (stack0xffffffffffffff30 != 0) {
          for (; (stack0xffffffffffffff30 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        BVUnitT<unsigned_long>::Clear
                  ((BVUnitT<unsigned_long> *)(debugStringBuffer + 0x28),(BVIndex)lVar2);
        pOVar16 = Func::GetGlobalObjTypeSpecFldInfo(this->m_func,(BVIndex)lVar2 + TVar1);
        uVar9 = ObjTypeSpecFldInfo::GetPropertyId(pOVar16);
        bVar5 = ObjTypeSpecFldInfo::IsBeingAdded(pOVar16);
        if (((bVar5) || (bVar5 = ObjTypeSpecFldInfo::IsLoadedFromProto(pOVar16), bVar5)) ||
           (bVar5 = ObjTypeSpecFldInfo::HasFixedValue(pOVar16), this = local_40, bVar5)) {
          bVar5 = ObjTypeSpecFldInfo::IsPoly(pOVar16);
          if (((bVar5) && (bVar5 = ObjTypeSpecFldInfo::HasFixedValue(pOVar16), bVar5)) &&
             ((bVar5 = ObjTypeSpecFldInfo::IsLoadedFromProto(pOVar16), !bVar5 &&
              (bVar5 = ObjTypeSpecFldInfo::UsesAccessor(pOVar16), !bVar5)))) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x1fee,
                               "(!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor()))"
                               ,
                               "!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor())"
                              );
            if (!bVar5) goto LAB_0056c854;
            *puVar11 = 0;
          }
          pLVar23 = local_40;
          pFVar15 = JITTimeWorkItem::GetJITTimeInfo(local_40->m_func->m_workItem);
          bVar5 = FunctionJITTimeInfo::HasSharedPropertyGuard(pFVar15,uVar9);
          if (bVar5) {
            uVar8 = Func::GetSourceContextId(pLVar23->m_func);
            uVar10 = Func::GetLocalFunctionId(pLVar23->m_func);
            bVar5 = Js::Phases::IsEnabled((Phases *)entry,ObjTypeSpecPhase,uVar8,uVar10);
            if (bVar5) {
LAB_0056c259:
              pJVar17 = Func::GetJITFunctionBody(pLVar23->m_func);
              pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar17);
              pcVar19 = Func::GetDebugNumberSet(pLVar23->m_func,(wchar (*) [42])&local_128);
              Output::Print(L"ObjTypeSpec: function %s(%s) registered equivalent type spec guard 0x%p with value 0x%p for property ID %u.\n"
                            ,pcVar18,pcVar19,local_60,
                            (local_60->super_JitEquivalentTypeGuard).super_JitIndexedPropertyGuard.
                            super_PropertyGuard.value,(ulong)uVar9);
              Output::Flush();
            }
            else {
              uVar8 = Func::GetSourceContextId(pLVar23->m_func);
              uVar10 = Func::GetLocalFunctionId(pLVar23->m_func);
              bVar5 = Js::Phases::IsEnabled((Phases *)entry,TracePropertyGuardsPhase,uVar8,uVar10);
              if (bVar5) goto LAB_0056c259;
            }
            Func::EnsurePropertyGuardsByPropertyId(pLVar23->m_func);
            Func::LinkGuardToPropertyId(pLVar23->m_func,uVar9,(JitIndexedPropertyGuard *)local_60);
            this = local_40;
          }
          else {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x1ff7,"(false)",
                               "Did we fail to create a shared property guard for a guarded property?"
                              );
            if (!bVar5) goto LAB_0056c854;
            *puVar11 = 0;
            this = local_40;
          }
        }
      }
    }
  }
  pEVar20 = (local_60->super_JitEquivalentTypeGuard).cache;
  if (pEVar20 == (EquivalentTypeCache *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1f3d,"(guard->GetCache() != nullptr)","guard->GetCache() != nullptr");
    if (!bVar5) {
LAB_0056c854:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar11 = 0;
    pEVar20 = (local_60->super_JitEquivalentTypeGuard).cache;
  }
  pEVar12 = IR::PropertySymOpnd::GetEquivalentTypeSet(propertySymOpnd);
  uVar14 = 8;
  if (pEVar12->count < 8) {
    uVar14 = (ulong)pEVar12->count;
  }
  for (uVar24 = 0; uVar14 != uVar24; uVar24 = uVar24 + 1) {
    local_128.t = (Type)Js::EquivalentTypeSet::GetType(pEVar12,(uint16)uVar24);
    pJVar13 = JITTypeHolderBase<void>::operator->(&local_128);
    pTVar21 = (Type *)JITType::GetAddr(pJVar13);
    pEVar20->types[uVar24] = pTVar21;
  }
  pBVar22 = (BVSparse<Memory::JitArenaAllocator> *)__tls_get_addr(&PTR_013e5f18);
  uVar24 = 0;
  bVar25 = 0;
  local_48 = pBVar22;
  do {
    if (uVar14 == uVar24) {
      pBVar22 = propertySymOpnd->guardedPropOps;
      capacity = BVSparse<Memory::JitArenaAllocator>::Count(pBVar22);
      local_128.t = (Type)IR::PropertySymOpnd::GetFirstEquivalentType(propertySymOpnd);
      pJVar13 = JITTypeHolderBase<void>::operator->(&local_128);
      typeId = JITType::GetTypeId(pJVar13);
      local_31 = Js::StaticType::Is(typeId);
      pLVar23 = local_40;
      JsUtil::
      BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary((BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        *)(debugStringBuffer + 0x28),local_40->m_alloc,capacity);
      _unit.word = (Type)Memory::
                         AllocateArray<Memory::ArenaAllocator,Js::EquivalentPropertyEntry,false>
                                   ((Memory *)pLVar23->m_alloc,
                                    (ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                                    (ulong)capacity);
      uVar9 = 0;
      do {
        pBVar22 = (BVSparse<Memory::JitArenaAllocator> *)pBVar22->head;
        if (pBVar22 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          (pEVar20->record).propertyCount = uVar9;
          __dest = Memory::
                   AllocateArray<NativeCodeData::AllocatorNoFixup<NativeCodeData::Array<Js::EquivalentPropertyEntry>>,Js::EquivalentPropertyEntry,false>
                             ((Memory *)&pLVar23->m_func->topFunc->nativeCodeDataAllocator,
                              (AllocatorNoFixup<NativeCodeData::Array<Js::EquivalentPropertyEntry>_>
                               *)NativeCodeData::
                                 AllocatorNoFixup<NativeCodeData::Array<Js::EquivalentPropertyEntry>_>
                                 ::Alloc,0,(ulong)uVar9);
          (pEVar20->record).properties = __dest;
          memcpy(__dest,(void *)_unit.word,(ulong)uVar9 << 3);
          JsUtil::
          BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::~BaseDictionary((BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                             *)(debugStringBuffer + 0x28));
          return &local_60->super_JitEquivalentTypeGuard;
        }
        entry = (EquivalentPropertyEntry *)CONCAT44(entry._4_4_,uVar9);
        TVar1 = *(Type *)&pBVar22->lastFoundIndex;
        local_88.word = ((Type *)&pBVar22->alloc)->word;
        while (pBVar4 = local_48, local_88.word != 0) {
          lVar2 = 0;
          if (local_88.word != 0) {
            for (; (local_88.word >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
            }
          }
          uVar9 = -(uint)(local_88.word == 0) | (uint)lVar2;
          BVUnitT<unsigned_long>::Clear(&local_88,uVar9);
          pOVar16 = Func::GetGlobalObjTypeSpecFldInfo(local_40->m_func,uVar9 + TVar1);
          local_38 = ObjTypeSpecFldInfo::GetPropertyId(pOVar16);
          bVar5 = ObjTypeSpecFldInfo::HasFixedValue(pOVar16);
          if (bVar5) {
            pEVar20->hasFixedValue = true;
          }
          bVar5 = ObjTypeSpecFldInfo::IsLoadedFromProto(pOVar16);
          if (bVar5) {
            pEVar20->isLoadedFromProto = true;
            uVar7 = 0xffff;
          }
          else {
            uVar7 = ObjTypeSpecFldInfo::GetSlotIndex(pOVar16);
          }
          bVar5 = ObjTypeSpecFldInfo::UsesAuxSlot(pOVar16);
          if ((local_31 != '\0') && (bVar6 = ObjTypeSpecFldInfo::IsBeingStored(pOVar16), bVar6)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pBVar4->head = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x1f7e,"(!isTypeStatic || !propOpInfo->IsBeingStored())",
                               "Why are we storing a field to an object of static type?");
            if (!bVar6) goto LAB_0056c854;
            *(undefined4 *)&pBVar4->head = 0;
          }
          local_58 = (EquivalentPropertyEntry *)0x0;
          bVar6 = JsUtil::
                  BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::TryGetValue<int>((BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                      *)(debugStringBuffer + 0x28),(int *)&local_38,&local_58);
          uVar14 = (ulong)entry & 0xffffffff;
          if (bVar6) {
            if ((uVar7 == local_58->slotIndex) && (local_58->isAuxSlot == bVar5)) {
              bVar5 = ObjTypeSpecFldInfo::IsBeingStored(pOVar16);
              local_58->mustBeWritable = (bool)(local_58->mustBeWritable | bVar5);
            }
            else {
              uVar8 = Func::GetSourceContextId(local_40->m_func);
              uVar10 = Func::GetLocalFunctionId(local_40->m_func);
              bVar6 = Js::Phases::IsEnabled
                                ((Phases *)&DAT_01453738,EquivObjTypeSpecPhase,uVar8,uVar10);
              if (bVar6) {
                pJVar17 = Func::GetJITFunctionBody(local_40->m_func);
                pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar17);
                pcVar19 = Func::GetDebugNumberSet(local_40->m_func,(wchar (*) [42])&local_128);
                Output::Print(L"EquivObjTypeSpec: top function %s (%s): duplicate property clash on %d \n"
                              ,pcVar18,pcVar19,(ulong)local_38);
                Output::Flush();
              }
              if (capacity <= (uint)entry) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *(undefined4 *)&local_48->head = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                   ,0x1f94,"(propIdCount < propOpCount)","propIdCount < propOpCount"
                                  );
                if (!bVar6) goto LAB_0056c854;
                *(undefined4 *)&local_48->head = 0;
              }
              local_58 = (EquivalentPropertyEntry *)(_unit.word + uVar14 * 8);
              *(uint *)(_unit.word + uVar14 * 8) = local_38;
              *(uint16 *)(_unit.word + 4 + uVar14 * 8) = uVar7;
              *(bool *)(_unit.word + 6 + uVar14 * 8) = bVar5;
              bVar5 = ObjTypeSpecFldInfo::IsBeingStored(pOVar16);
              entry = (EquivalentPropertyEntry *)CONCAT44(entry._4_4_,(uint)entry + 1);
              local_58->mustBeWritable = bVar5;
            }
          }
          else {
            if (capacity <= (uint)entry) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)&local_48->head = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x1f9f,"(propIdCount < propOpCount)","propIdCount < propOpCount");
              if (!bVar6) goto LAB_0056c854;
              *(undefined4 *)&local_48->head = 0;
            }
            local_58 = (EquivalentPropertyEntry *)(_unit.word + uVar14 * 8);
            *(uint *)(_unit.word + uVar14 * 8) = local_38;
            *(uint16 *)(_unit.word + 4 + uVar14 * 8) = uVar7;
            *(bool *)(_unit.word + 6 + uVar14 * 8) = bVar5;
            bVar5 = ObjTypeSpecFldInfo::IsBeingStored(pOVar16);
            local_58->mustBeWritable = bVar5;
            JsUtil::
            BaseDictionary<int,Js::EquivalentPropertyEntry*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<int,Js::EquivalentPropertyEntry*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                      ((BaseDictionary<int,Js::EquivalentPropertyEntry*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)(debugStringBuffer + 0x28),(int *)&local_38,&local_58);
            entry = (EquivalentPropertyEntry *)CONCAT44(entry._4_4_,(uint)entry + 1);
          }
        }
        pLVar23 = local_40;
        uVar9 = (uint)entry;
      } while( true );
    }
    bVar5 = pEVar20->types[uVar24] == (Type *)0x0;
    if ((bool)(~bVar25 & 1 | bVar5)) {
      bVar25 = bVar25 | bVar5;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)&pBVar22->head = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1f57,"(false)","there_was_a_null_type ? something is wrong here.");
      if (!bVar5) goto LAB_0056c854;
      *(undefined4 *)&pBVar22->head = 0;
    }
    uVar24 = uVar24 + 1;
  } while( true );
}

Assistant:

Js::JitEquivalentTypeGuard*
Lowerer::CreateEquivalentTypeGuardAndLinkToGuardedProperties(IR::PropertySymOpnd* propertySymOpnd)
{
    // We should always have a list of guarded properties.
    Assert(propertySymOpnd->HasObjTypeSpecFldInfo() && propertySymOpnd->HasEquivalentTypeSet() && propertySymOpnd->GetGuardedPropOps());

    Js::JitEquivalentTypeGuard* guard;
    if (propertySymOpnd->ShouldUsePolyEquivTypeGuard(this->m_func))
    {
        Js::JitPolyEquivalentTypeGuard *polyGuard = this->m_func->CreatePolyEquivalentTypeGuard(propertySymOpnd->GetObjTypeSpecFldId());

        // Copy types from the type set to the guard's value locations
        Js::EquivalentTypeSet* typeSet = propertySymOpnd->GetEquivalentTypeSet();
        for (uint16 ti = 0; ti < typeSet->GetCount(); ti++)
        {
            intptr_t typeToCache = typeSet->GetType(ti)->GetAddr();
            polyGuard->SetPolyValue(typeToCache, polyGuard->GetIndexForValue(typeToCache));
        }

        guard = polyGuard;
    }
    else
    {
        guard = this->m_func->CreateEquivalentTypeGuard(propertySymOpnd->GetFirstEquivalentType(), propertySymOpnd->GetObjTypeSpecFldId());
    }

    if (m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())
    {
        LinkGuardToGuardedProperties(propertySymOpnd->GetGuardedPropOps(), [=](Js::PropertyId propertyId)
        {
            if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->m_func) || PHASE_TRACE(Js::TracePropertyGuardsPhase, this->m_func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("ObjTypeSpec: function %s(%s) registered equivalent type spec guard 0x%p with value 0x%p for property ID %u.\n"),
                    this->m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
                    guard, guard->GetValue(), propertyId);
                Output::Flush();
            }

            this->m_func->EnsurePropertyGuardsByPropertyId();
            this->m_func->LinkGuardToPropertyId(propertyId, guard);
        });
    }

    Assert(guard->GetCache() != nullptr);
    Js::EquivalentTypeCache* cache = guard->GetCache();

    // TODO (ObjTypeSpec): If we delayed populating the types until encoder, we could bulk allocate all equivalent type caches
    // in one block from the heap. This would allow us to not allocate them from the native code data allocator and free them
    // when no longer needed. However, we would need to store the global property operation ID in the guard, so we can look up
    // the info in the encoder. Perhaps we could overload the cache pointer to be the ID until encoder.

    // Copy types from the type set to the guard's cache
    Js::EquivalentTypeSet* typeSet = propertySymOpnd->GetEquivalentTypeSet();
    uint16 cachedTypeCount = typeSet->GetCount() < EQUIVALENT_TYPE_CACHE_SIZE ? typeSet->GetCount() : EQUIVALENT_TYPE_CACHE_SIZE;
    for (uint16 ti = 0; ti < cachedTypeCount; ti++)
    {
        cache->types[ti] = (Js::Type*)typeSet->GetType(ti)->GetAddr();
    }

#ifdef DEBUG
    bool there_was_a_null_type = false;
    for (uint16 ti = 0; ti < cachedTypeCount; ti++)
    {
        if (cache->types[ti] == nullptr)
        {
            there_was_a_null_type = true;
        }
        else if (there_was_a_null_type)
        {
            AssertMsg(false, "there_was_a_null_type ? something is wrong here.");
        }
    }
#endif

    // Populate property ID and slot index arrays on the guard's cache. We iterate over the
    // bit vector of property operations protected by this guard, but some property operations
    // may be referring to the same property ID (but not share the same cache). We skip
    // redundant entries by maintaining a hash set of property IDs we've already encountered.

    auto propOps = propertySymOpnd->GetGuardedPropOps();
    uint propOpCount = propOps->Count();

    bool isTypeStatic = Js::StaticType::Is(propertySymOpnd->GetFirstEquivalentType()->GetTypeId());
    JsUtil::BaseDictionary<Js::PropertyId, Js::EquivalentPropertyEntry*, JitArenaAllocator> propIds(this->m_alloc, propOpCount);
    Js::EquivalentPropertyEntry* properties = AnewArray(this->m_alloc, Js::EquivalentPropertyEntry, propOpCount);
    uint propIdCount = 0;

    FOREACH_BITSET_IN_SPARSEBV(propOpId, propOps)
    {
        ObjTypeSpecFldInfo* propOpInfo = this->m_func->GetGlobalObjTypeSpecFldInfo(propOpId);
        Js::PropertyId propertyId = propOpInfo->GetPropertyId();
        Js::PropertyIndex propOpIndex = Js::Constants::NoSlot;
        bool hasFixedValue = propOpInfo->HasFixedValue();
        if (hasFixedValue)
        {
            cache->SetHasFixedValue();
        }
        bool isLoadedFromProto = propOpInfo->IsLoadedFromProto();
        if (isLoadedFromProto)
        {
            cache->SetIsLoadedFromProto();
        }
        else
        {
            propOpIndex = propOpInfo->GetSlotIndex();
        }
        bool propOpUsesAuxSlot = propOpInfo->UsesAuxSlot();

        AssertMsg(!isTypeStatic || !propOpInfo->IsBeingStored(), "Why are we storing a field to an object of static type?");

        Js::EquivalentPropertyEntry* entry = nullptr;
        if (propIds.TryGetValue(propertyId, &entry))
        {
            if (propOpIndex == entry->slotIndex && propOpUsesAuxSlot == entry->isAuxSlot)
            {
                entry->mustBeWritable |= propOpInfo->IsBeingStored();
            }
            else
            {
                // Due to inline cache sharing we have the same property accessed using different caches
                // with inconsistent info. This means a guaranteed bailout on the equivalent type check.
                // We'll just let it happen and turn off the optimization for this function. We could avoid
                // this problem by tracking property information on the value type in glob opt.
                if (PHASE_TRACE(Js::EquivObjTypeSpecPhase, this->m_func))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    Output::Print(_u("EquivObjTypeSpec: top function %s (%s): duplicate property clash on %d \n"),
                        m_func->GetJITFunctionBody()->GetDisplayName(), m_func->GetDebugNumberSet(debugStringBuffer), propertyId);
                    Output::Flush();
                }
                Assert(propIdCount < propOpCount);
                __analysis_assume(propIdCount < propOpCount);
                entry = &properties[propIdCount++];
                entry->propertyId = propertyId;
                entry->slotIndex = propOpIndex;
                entry->isAuxSlot = propOpUsesAuxSlot;
                entry->mustBeWritable = propOpInfo->IsBeingStored();
            }
        }
        else
        {
            Assert(propIdCount < propOpCount);
            __analysis_assume(propIdCount < propOpCount);
            entry = &properties[propIdCount++];
            entry->propertyId = propertyId;
            entry->slotIndex = propOpIndex;
            entry->isAuxSlot = propOpUsesAuxSlot;
            entry->mustBeWritable = propOpInfo->IsBeingStored();
            propIds.AddNew(propertyId, entry);
        }
    }
    NEXT_BITSET_IN_SPARSEBV;

    cache->record.propertyCount = propIdCount;
    // Js::EquivalentPropertyEntry does not contain pointer, no need to fixup
    cache->record.properties = NativeCodeDataNewArrayNoFixup(this->m_func->GetNativeCodeDataAllocator(), Js::EquivalentPropertyEntry, propIdCount);

    memcpy(cache->record.properties, properties, propIdCount * sizeof(Js::EquivalentPropertyEntry));

    return guard;
}